

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O0

void __thiscall
LinearScan::FillBailOutOffset
          (LinearScan *this,int *offset,StackSym *stackSym,FillBailOutState *state,Instr *instr)

{
  uint uVar1;
  Lifetime *lifetime_00;
  code *pcVar2;
  Instr *this_00;
  FillBailOutState *pFVar3;
  bool bVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint32 uVar8;
  BailOutKind BVar9;
  SymID SVar10;
  int iVar11;
  undefined4 *puVar12;
  FillBailOutState *pFVar13;
  BailOutInfo *this_01;
  Lifetime *lifetime;
  void *local_38;
  Instr *local_30;
  Instr *instr_local;
  FillBailOutState *state_local;
  StackSym *stackSym_local;
  int *offset_local;
  LinearScan *this_local;
  
  local_30 = instr;
  instr_local = (Instr *)state;
  state_local = (FillBailOutState *)stackSym;
  stackSym_local = (StackSym *)offset;
  offset_local = (int *)this;
  if (*offset != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                       ,0x498,"(*offset == 0)",
                       "Can\'t have two active lifetime for the same byte code register");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar12 = 0;
  }
  bVar4 = StackSym::IsConst((StackSym *)state_local);
  this_00 = instr_local;
  if (bVar4) {
    local_38 = (void *)StackSym::GetLiteralConstValue_PostGlobOpt((StackSym *)state_local);
    SList<void_*,_Memory::ArenaAllocator,_RealCount>::Prepend
              ((SList<void_*,_Memory::ArenaAllocator,_RealCount> *)this_00,&local_38);
    uVar5 = RealCount::Count((RealCount *)&instr_local->m_noLazyHelperAssert);
    uVar6 = GetBailOutRegisterSaveSlotCount();
    uVar7 = GetBailOutReserveSlotCount();
    *(uint *)&(stackSym_local->super_Sym)._vptr_Sym = uVar5 + uVar6 + uVar7;
  }
  else if ((state_local->registerSaveCount >> 6 & 1) == 0) {
    lifetime_00 = (Lifetime *)state_local->registerSaveSyms[5];
    bVar4 = IR::Instr::HasLazyBailOut(local_30);
    if ((!bVar4) &&
       (((lifetime_00 == (Lifetime *)0x0 ||
         (uVar1 = lifetime_00->start, uVar8 = IR::Instr::GetNumber(local_30), uVar8 <= uVar1)) ||
        (uVar8 = IR::Instr::GetNumber(local_30), lifetime_00->end < uVar8)))) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar12 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                         ,0x4ab,
                         "(instr->HasLazyBailOut() || lifetime && lifetime->start < instr->GetNumber() && instr->GetNumber() <= lifetime->end)"
                         ,
                         "instr->HasLazyBailOut() || lifetime && lifetime->start < instr->GetNumber() && instr->GetNumber() <= lifetime->end"
                        );
      if (!bVar4) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar12 = 0;
    }
    BVar9 = IR::Instr::GetBailOutKind(local_30);
    if (((BVar9 == BailOutOnException) &&
        (bVar4 = StackSym::IsAllocated((StackSym *)state_local), pFVar3 = state_local, !bVar4)) &&
       (pFVar13 = (FillBailOutState *)Region::GetExceptionObjectSym(this->currentRegion),
       pFVar3 != pFVar13)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar12 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                         ,0x4b1,
                         "(stackSym->IsAllocated() || (stackSym == this->currentRegion->GetExceptionObjectSym()))"
                         ,
                         "stackSym->IsAllocated() || (stackSym == this->currentRegion->GetExceptionObjectSym())"
                        );
      if (!bVar4) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar12 = 0;
    }
    PrepareForUse(this,lifetime_00);
    bVar4 = IR::Instr::HasLazyBailOut(local_30);
    if (bVar4) {
      this_01 = IR::Instr::GetBailOutInfo(local_30);
      SVar10 = BailOutInfo::GetClearedUseOfDstId(this_01);
      if (SVar10 == *(SymID *)&(state_local->constantList).
                               super_SList<void_*,_Memory::ArenaAllocator,_RealCount>.allocator) {
        iVar11 = SaveSymbolToReg(this,RegRAX,(FillBailOutState *)instr_local,(StackSym *)state_local
                                );
        *(int *)&(stackSym_local->super_Sym)._vptr_Sym = iVar11;
        return;
      }
    }
    if (((*(ushort *)&lifetime_00->field_0x9c & 1) == 0) &&
       ((BVar9 = IR::Instr::GetBailOutKind(local_30), pFVar3 = state_local,
        BVar9 != BailOutOnException ||
        (pFVar13 = (FillBailOutState *)Region::GetExceptionObjectSym(this->currentRegion),
        pFVar3 == pFVar13)))) {
      iVar11 = SaveSymbolToReg(this,lifetime_00->reg,(FillBailOutState *)instr_local,
                               (StackSym *)state_local);
      *(int *)&(stackSym_local->super_Sym)._vptr_Sym = iVar11;
    }
    else {
      bVar4 = StackSym::IsAllocated((StackSym *)state_local);
      if ((!bVar4) && ((*(ushort *)&lifetime_00->field_0x9c >> 3 & 1) == 0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 1;
        bVar4 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                           ,0x4ca,"(stackSym->IsAllocated() || lifetime->isDeadStore)",
                           "stackSym->IsAllocated() || lifetime->isDeadStore");
        if (!bVar4) {
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar12 = 0;
      }
      *(int *)&(stackSym_local->super_Sym)._vptr_Sym = *(int *)state_local->registerSaveSyms + -0x10
      ;
    }
  }
  else {
    if ((state_local->registerSaveCount & 1) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar12 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LinearScan.cpp"
                         ,0x4a2,"(!stackSym->m_isSingleDef)","!stackSym->m_isSingleDef");
      if (!bVar4) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar12 = 0;
    }
    lifetime = (Lifetime *)state_local->registerSaveSyms[1];
    SList<void_*,_Memory::ArenaAllocator,_RealCount>::Prepend
              ((SList<void_*,_Memory::ArenaAllocator,_RealCount> *)instr_local,&lifetime);
    uVar5 = RealCount::Count((RealCount *)&instr_local->m_noLazyHelperAssert);
    uVar6 = GetBailOutRegisterSaveSlotCount();
    uVar7 = GetBailOutReserveSlotCount();
    *(uint *)&(stackSym_local->super_Sym)._vptr_Sym = uVar5 + uVar6 + uVar7;
  }
  return;
}

Assistant:

void
LinearScan::FillBailOutOffset(int * offset, StackSym * stackSym, FillBailOutState * state, IR::Instr * instr)
{
    AssertMsg(*offset == 0, "Can't have two active lifetime for the same byte code register");
    if (stackSym->IsConst())
    {
        state->constantList.Prepend(reinterpret_cast<Js::Var>(stackSym->GetLiteralConstValue_PostGlobOpt()));

        // Constant offset are offset by the number of register save slots
        *offset = state->constantList.Count() + GetBailOutRegisterSaveSlotCount() + GetBailOutReserveSlotCount();
    }
    else if (stackSym->m_isEncodedConstant)
    {
        Assert(!stackSym->m_isSingleDef);
        state->constantList.Prepend((Js::Var)stackSym->constantValue);

        // Constant offset are offset by the number of register save slots
        *offset = state->constantList.Count() + GetBailOutRegisterSaveSlotCount() + GetBailOutReserveSlotCount();
    }
    else
    {
        Lifetime * lifetime = stackSym->scratch.linearScan.lifetime;
        Assert(instr->HasLazyBailOut() || lifetime && lifetime->start < instr->GetNumber() && instr->GetNumber() <= lifetime->end);
        if (instr->GetBailOutKind() == IR::BailOutOnException)
        {
            // Apart from the exception object sym, lifetimes for all other syms that need to be restored at this bailout,
            // must have been spilled at least once (at the TryCatch, or at the Leave, or both)
            // Post spilling, a lifetime could have been second chance allocated. But, it should still have stack allocated for its sym
            Assert(stackSym->IsAllocated() || (stackSym == this->currentRegion->GetExceptionObjectSym()));
        }

        this->PrepareForUse(lifetime);

        if (instr->HasLazyBailOut() && instr->GetBailOutInfo()->GetClearedUseOfDstId() == stackSym->m_id)
        {
            // Force value of bytecode upward exposed destination symbol of a call instruction
            // with lazy bailout to be restored from `rax`
            // We clear the bit in bytecode upward exposed for destination symbol of a call
            // instructions with lazy bailout in globopt to get past the assert that the
            // register hasn't been initialized yet.
            // Now, since the value is actually in rax, during FillBailOutRecord,
            // we can always force the bailout to restore that symbol from rax.
#ifdef _M_X64
            *offset = this->SaveSymbolToReg(RegRAX, state, stackSym);
#elif _M_IX86
            *offset = this->SaveSymbolToReg(RegEAX, state, stackSym);
#else
            AssertMsg(false, "Lazy bailout for ARM is not yet supported");
#endif
        }
        else if (lifetime->isSpilled ||
            ((instr->GetBailOutKind() == IR::BailOutOnException) && (stackSym != this->currentRegion->GetExceptionObjectSym()))) // BailOutOnException must restore from memory
        {
            Assert(stackSym->IsAllocated() || lifetime->isDeadStore);
#ifdef MD_GROW_LOCALS_AREA_UP
            *offset = -((int)stackSym->m_offset + BailOutInfo::StackSymBias);
#else
            // Stack offset are negative, includes the PUSH EBP and return address
            *offset = stackSym->m_offset - (2 * MachPtr);
#endif
        }
        else
        {
            *offset = this->SaveSymbolToReg(lifetime->reg, state, stackSym);
        }
    }
}